

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert_issuer_source_sync_unittest.h
# Opt level: O0

void __thiscall
bssl::CertIssuerSourceSyncTest<bssl::(anonymous_namespace)::CertIssuerSourceStaticTestDelegate>::
~CertIssuerSourceSyncTest
          (CertIssuerSourceSyncTest<bssl::(anonymous_namespace)::CertIssuerSourceStaticTestDelegate>
           *this)

{
  CertIssuerSourceSyncTest<bssl::(anonymous_namespace)::CertIssuerSourceStaticTestDelegate>
  *this_local;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__CertIssuerSourceSyncTest_00915b38;
  ::std::shared_ptr<const_bssl::ParsedCertificate>::~shared_ptr(&this->e2_);
  ::std::shared_ptr<const_bssl::ParsedCertificate>::~shared_ptr(&this->e1_);
  ::std::shared_ptr<const_bssl::ParsedCertificate>::~shared_ptr(&this->d_);
  ::std::shared_ptr<const_bssl::ParsedCertificate>::~shared_ptr(&this->c2_);
  ::std::shared_ptr<const_bssl::ParsedCertificate>::~shared_ptr(&this->c1_);
  ::std::shared_ptr<const_bssl::ParsedCertificate>::~shared_ptr(&this->i3_2_);
  ::std::shared_ptr<const_bssl::ParsedCertificate>::~shared_ptr(&this->i3_1_);
  ::std::shared_ptr<const_bssl::ParsedCertificate>::~shared_ptr(&this->i2_);
  ::std::shared_ptr<const_bssl::ParsedCertificate>::~shared_ptr(&this->i1_2_);
  ::std::shared_ptr<const_bssl::ParsedCertificate>::~shared_ptr(&this->i1_1_);
  ::std::shared_ptr<const_bssl::ParsedCertificate>::~shared_ptr(&this->root_);
  anon_unknown_3::CertIssuerSourceStaticTestDelegate::~CertIssuerSourceStaticTestDelegate
            (&this->delegate_);
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

void SetUp() override {
    ASSERT_TRUE(ReadTestCert("root.pem", &root_));
    ASSERT_TRUE(ReadTestCert("i1_1.pem", &i1_1_));
    ASSERT_TRUE(ReadTestCert("i1_2.pem", &i1_2_));
    ASSERT_TRUE(ReadTestCert("i2.pem", &i2_));
    ASSERT_TRUE(ReadTestCert("i3_1.pem", &i3_1_));
    ASSERT_TRUE(ReadTestCert("i3_2.pem", &i3_2_));
    ASSERT_TRUE(ReadTestCert("c1.pem", &c1_));
    ASSERT_TRUE(ReadTestCert("c2.pem", &c2_));
    ASSERT_TRUE(ReadTestCert("d.pem", &d_));
    ASSERT_TRUE(ReadTestCert("e1.pem", &e1_));
    ASSERT_TRUE(ReadTestCert("e2.pem", &e2_));
  }